

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.cc
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
KmerCounter::count_spectra
          (KmerCounter *this,string *name,uint16_t maxf,bool unique_in_graph,bool present_in_graph)

{
  uint uVar1;
  KmerCounter *this_00;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_01;
  ulong uVar2;
  reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  uint in_ECX;
  ushort uVar8;
  long in_RSI;
  string *in_RDI;
  uint in_R8D;
  byte in_R9B;
  int i_1;
  int i;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *cv;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *s;
  undefined2 local_a2;
  undefined2 local_92;
  allocator_type *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  string *name_00;
  undefined4 local_40;
  undefined4 local_3c;
  
  uVar8 = (ushort)in_ECX;
  uVar1 = in_R8D & 1;
  this_00 = (KmerCounter *)(ulong)((in_ECX & 0xffff) + 1);
  name_00 = in_RDI;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x3dea20);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)CONCAT44(in_ECX,in_R8D),
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x3dea43);
  this_01 = get_count_by_name(this_00,name_00);
  if (uVar1 == 0) {
    local_40 = 0;
    while( true ) {
      pvVar3 = std::
               vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               ::operator[]((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                             *)(in_RSI + 0x48),0);
      sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(pvVar3);
      if (sVar4 <= (ulong)(long)local_40) break;
      if ((in_R9B & 1) == 0) {
LAB_003dec05:
        pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           (this_01,(long)local_40);
        local_a2 = uVar8;
        if (*pvVar6 <= uVar8) {
          pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             (this_01,(long)local_40);
          local_a2 = *pvVar6;
        }
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)name_00,
                            (ulong)local_a2);
        *pvVar7 = *pvVar7 + 1;
      }
      else {
        pvVar3 = std::
                 vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                               *)(in_RSI + 0x48),0);
        pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           (pvVar3,(long)local_40);
        if (*pvVar5 != 0) goto LAB_003dec05;
      }
      local_40 = local_40 + 1;
    }
  }
  else {
    local_3c = 0;
    while( true ) {
      uVar2 = (ulong)local_3c;
      pvVar3 = std::
               vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               ::operator[]((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                             *)(in_RSI + 0x48),0);
      sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(pvVar3);
      if (sVar4 <= uVar2) break;
      pvVar3 = std::
               vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               ::operator[]((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                             *)(in_RSI + 0x48),0);
      pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (pvVar3,(long)local_3c);
      if (*pvVar5 == 1) {
        pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           (this_01,(long)local_3c);
        local_92 = uVar8;
        if (*pvVar6 <= uVar8) {
          pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             (this_01,(long)local_3c);
          local_92 = *pvVar6;
        }
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)name_00,
                            (ulong)local_92);
        *pvVar7 = *pvVar7 + 1;
      }
      local_3c = local_3c + 1;
    }
  }
  return (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI;
}

Assistant:

std::vector<uint64_t> KmerCounter::count_spectra(std::string name, uint16_t maxf, bool unique_in_graph, bool present_in_graph) {
    std::vector<uint64_t> s(maxf+1);
    auto &cv=get_count_by_name(name);
    if (unique_in_graph){
        for (auto i=0;i<counts[0].size();++i){
            if (counts[0][i]==1)
                ++s[(cv[i]>maxf ? maxf : cv[i])];
        }

    } else {
        for (auto i=0;i<counts[0].size();++i){
            if ((not present_in_graph) or counts[0][i]>0)
                ++s[(cv[i]>maxf ? maxf : cv[i])];
        }
    }
    return s;
}